

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  LogMessageFatal aLStack_18 [16];
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 != (Extension *)0x0) {
    return (void *)(pEVar1->field_0).int64_t_value;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,0x1c7,0x14,"extension != nullptr");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (aLStack_18,0x14,"Extension not found.");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}